

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall tchecker::syncprod::system_t::extract_asynchronous_edges(system_t *this)

{
  bool bVar1;
  const_iterator cVar2;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar3;
  edge_const_shared_ptr_t local_38;
  
  rVar3 = tchecker::system::edges_t::edges(&(this->super_system_t).super_edges_t);
  for (cVar2._M_current =
            (shared_ptr<tchecker::system::edge_t> *)rVar3._begin.super_const_iterator._M_current;
      (const_iterator)cVar2._M_current !=
      rVar3._end.super_const_iterator._M_current.super_const_iterator;
      cVar2._M_current = cVar2._M_current + 1) {
    local_38.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ((cVar2._M_current)->
         super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_38.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         ((cVar2._M_current)->
         super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_38.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar1 = is_asynchronous(this,local_38.
                                 super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
    if (bVar1) {
      add_asynchronous_edge(this,&local_38);
    }
    if (local_38.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.
                 super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void system_t::extract_asynchronous_edges()
{
  for (tchecker::system::edge_const_shared_ptr_t const & edge : edges())
    if (is_asynchronous(*edge))
      add_asynchronous_edge(edge);
}